

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay_linux.hpp
# Opt level: O0

void timeout_handler(void)

{
  size_type sVar1;
  pthread_t __threadid;
  reference this;
  native_handle_type __threadid_00;
  
  sVar1 = std::vector<std::thread,_std::allocator<std::thread>_>::size
                    (&global_replayer->thread_pool);
  if (sVar1 < 2) {
    this = std::vector<std::thread,_std::allocator<std::thread>_>::front
                     (&global_replayer->thread_pool);
    __threadid_00 = std::thread::native_handle(this);
    pthread_kill(__threadid_00,6);
  }
  else {
    fprintf(_stderr,
            "Fossilize ERROR: Using timeout handling with more than one worker thread, cannot know which thread is the culprit.\n"
           );
    fflush(_stderr);
    __threadid = pthread_self();
    pthread_kill(__threadid,6);
  }
  return;
}

Assistant:

static void timeout_handler()
{
	if (global_replayer->thread_pool.size() > 1)
	{
		LOGE("Using timeout handling with more than one worker thread, cannot know which thread is the culprit.\n");
		// Just send signal to main thread so we don't emit any false positives.
		pthread_kill(pthread_self(), SIGABRT);
	}
	else
	{
		// Pretend we crashed in a safe way.
		// Send a signal to the worker thread to make sure we tear down on that thread.
		pthread_kill(global_replayer->thread_pool.front().native_handle(), SIGABRT);
	}
}